

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O0

void __thiscall
QUtcTimeZonePrivate::QUtcTimeZonePrivate(QUtcTimeZonePrivate *this,qint32 offsetSeconds)

{
  bool bVar1;
  UtcData *pUVar2;
  UtcData *pUVar3;
  qsizetype qVar4;
  int in_ESI;
  QUtcTimeZonePrivate *in_RDI;
  long in_FS_OFFSET;
  qsizetype cut;
  UtcData *data;
  QByteArrayView cutId;
  QByteArrayView ianaId;
  QByteArray id;
  QString name;
  QByteArrayView *in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe10;
  char in_stack_fffffffffffffe17;
  QByteArrayView *in_stack_fffffffffffffe18;
  QByteArrayView *in_stack_fffffffffffffe20;
  _func_bool_UtcData_int *in_stack_fffffffffffffe28;
  int *in_stack_fffffffffffffe30;
  UtcData *in_stack_fffffffffffffe38;
  UtcData *in_stack_fffffffffffffe40;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_ESI;
  QTimeZonePrivate::QTimeZonePrivate
            ((QTimeZonePrivate *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
  (in_RDI->super_QTimeZonePrivate)._vptr_QTimeZonePrivate =
       (_func_int **)&PTR__QUtcTimeZonePrivate_00beb5a0;
  QString::QString((QString *)0x73c860);
  QString::QString((QString *)0x73c876);
  QString::QString((QString *)0x73c88f);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x73c8c5);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)0x73c8f1);
  std::begin<QtTimeZoneCldr::UtcData_const,42ul>((UtcData (*) [42])QtTimeZoneCldr::utcDataTable);
  std::end<QtTimeZoneCldr::UtcData_const,42ul>((UtcData (*) [42])QtTimeZoneCldr::utcDataTable);
  pUVar2 = std::
           lower_bound<QtTimeZoneCldr::UtcData_const*,int,bool(*)(QtTimeZoneCldr::UtcData,int)noexcept>
                     (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                      in_stack_fffffffffffffe28);
  pUVar3 = std::end<QtTimeZoneCldr::UtcData_const,42ul>
                     ((UtcData (*) [42])QtTimeZoneCldr::utcDataTable);
  if ((pUVar2 == pUVar3) || (pUVar2->offsetFromUtc != local_c)) {
    QTimeZonePrivate::isoOffsetFormat
              ((int)((ulong)in_stack_fffffffffffffe40 >> 0x20),(NameType)in_stack_fffffffffffffe40);
    QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                       (QString *)in_stack_fffffffffffffe08);
    QString::~QString((QString *)0x73cc5c);
    QString::toUtf8((QString *)in_stack_fffffffffffffe08);
    QByteArray::operator=
              ((QByteArray *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
               (QByteArray *)in_stack_fffffffffffffe08);
    QByteArray::~QByteArray((QByteArray *)0x73cc92);
  }
  else {
    QtTimeZoneCldr::UtcData::id
              ((UtcData *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
    qVar4 = QByteArrayView::indexOf
                      (in_stack_fffffffffffffe18,in_stack_fffffffffffffe17,
                       (qsizetype)in_stack_fffffffffffffe08);
    if (-1 < qVar4) {
      QByteArrayView::first(in_stack_fffffffffffffe08,0x73ca55);
    }
    QTimeZonePrivate::utcQByteArray();
    QByteArrayView::QByteArrayView<QByteArray,_true>
              (in_stack_fffffffffffffe20,(QByteArray *)in_stack_fffffffffffffe18);
    bVar1 = ::operator==((QByteArrayView *)
                         CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                         in_stack_fffffffffffffe08);
    QByteArray::~QByteArray((QByteArray *)0x73cac5);
    if (bVar1) {
      QTimeZonePrivate::utcQByteArray();
      QByteArray::operator=
                ((QByteArray *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                 (QByteArray *)in_stack_fffffffffffffe08);
      QByteArray::~QByteArray((QByteArray *)0x73cb05);
      QTimeZonePrivate::utcQString();
      QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                         (QString *)in_stack_fffffffffffffe08);
      QString::~QString((QString *)0x73cb36);
    }
    else {
      QByteArrayView::toByteArray
                ((QByteArrayView *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
      QByteArray::operator=
                ((QByteArray *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                 (QByteArray *)in_stack_fffffffffffffe08);
      QByteArray::~QByteArray((QByteArray *)0x73cbe0);
      QString::fromUtf8<void>
                ((QByteArray *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10));
      QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                         (QString *)in_stack_fffffffffffffe08);
      QString::~QString((QString *)0x73cc16);
    }
  }
  init(in_RDI,(EVP_PKEY_CTX *)&local_48);
  QByteArray::~QByteArray((QByteArray *)0x73ccd1);
  QString::~QString((QString *)0x73ccde);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QUtcTimeZonePrivate::QUtcTimeZonePrivate(qint32 offsetSeconds)
{
    QString name;
    QByteArray id;
    // If there's an IANA ID for this offset, use it:
    const auto data = std::lower_bound(std::begin(utcDataTable), std::end(utcDataTable),
                                       offsetSeconds, atLowerUtcOffset);
    if (data != std::end(utcDataTable) && data->offsetFromUtc == offsetSeconds) {
        QByteArrayView ianaId = data->id();
        qsizetype cut = ianaId.indexOf(' ');
        QByteArrayView cutId = (cut < 0 ? ianaId : ianaId.first(cut));
        if (cutId == utcQByteArray()) {
            // optimize: reuse interned strings for the common case
            id = utcQByteArray();
            name = utcQString();
        } else {
            // fallback to allocate new strings otherwise
            id = cutId.toByteArray();
            name = QString::fromUtf8(id);
        }
        Q_ASSERT(!name.isEmpty());
    } else { // Fall back to a UTC-offset name:
        name = isoOffsetFormat(offsetSeconds, QTimeZone::ShortName);
        id = name.toUtf8();
    }
    init(id, offsetSeconds, name, name, QLocale::AnyTerritory, name);
}